

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::detail::Dispatch_Function::build_type_infos
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs)

{
  pointer psVar1;
  pointer pTVar2;
  bool bVar3;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *type_infos;
  pointer pTVar4;
  long lVar5;
  ulong uVar6;
  pointer psVar7;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> param_types;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_58;
  pointer local_40;
  ulong local_38;
  
  psVar7 = (t_funcs->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (t_funcs->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 == psVar1) {
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              (__return_storage_ptr__,
               &((psVar7->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->m_types);
    psVar7 = psVar7 + 1;
    if (psVar7 != psVar1) {
      uVar6 = 0;
      local_40 = psVar1;
      do {
        std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
                  (&local_58,
                   &((psVar7->
                     super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->m_types);
        pTVar4 = (__return_storage_ptr__->
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar2 = (__return_storage_ptr__->
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        local_38 = uVar6 & 0xff;
        if ((long)local_58.
                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_58.
                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long)pTVar2 - (long)pTVar4) {
          local_38 = 1;
        }
        if (pTVar2 != pTVar4) {
          lVar5 = 0;
          uVar6 = 0;
          do {
            if ((ulong)(((long)local_58.
                               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_58.
                               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       ) <= uVar6) break;
            bVar3 = Type_Info::operator==
                              ((Type_Info *)((long)&pTVar4->m_type_info + lVar5),
                               (Type_Info *)
                               ((long)&(local_58.
                                        super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_type_info +
                               lVar5));
            if (!bVar3) {
              pTVar4 = (__return_storage_ptr__->
                       super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              *(pointer_____offset_0x10___ **)((long)&pTVar4->m_type_info + lVar5) =
                   &Boxed_Value::typeinfo;
              *(pointer_____offset_0x10___ **)((long)&pTVar4->m_bare_type_info + lVar5) =
                   &Boxed_Value::typeinfo;
              *(undefined4 *)((long)&pTVar4->m_flags + lVar5) = 0;
            }
            uVar6 = uVar6 + 1;
            pTVar4 = (__return_storage_ptr__->
                     super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar5 = lVar5 + 0x18;
          } while (uVar6 < (ulong)(((long)(__return_storage_ptr__->
                                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4
                                   >> 3) * -0x5555555555555555));
        }
        if (local_58.
            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        psVar7 = psVar7 + 1;
        uVar6 = local_38;
      } while (psVar7 != local_40);
      if ((local_38 & 1) != 0) {
        std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::resize
                  (__return_storage_ptr__,1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Type_Info> build_type_infos(const std::vector<Proxy_Function> &t_funcs)
        {
          auto begin = t_funcs.cbegin();
          const auto &end = t_funcs.cend();

          if (begin != end)
          {
            std::vector<Type_Info> type_infos = (*begin)->get_param_types();

            ++begin;

            bool size_mismatch = false;

            while (begin != end)
            {
              std::vector<Type_Info> param_types = (*begin)->get_param_types();

              if (param_types.size() != type_infos.size())
              {
                size_mismatch = true;
              }

              for (size_t i = 0; i < type_infos.size() && i < param_types.size(); ++i)
              {
                if (!(type_infos[i] == param_types[i]))
                {
                  type_infos[i] = detail::Get_Type_Info<Boxed_Value>::get();
                }
              }

              ++begin;
            }

            assert(type_infos.size() > 0 && " type_info vector size is < 0, this is only possible if something else is broken");

            if (size_mismatch)
            {
              type_infos.resize(1);
            }

            return type_infos;
          }

          return std::vector<Type_Info>();
        }